

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

lws_vhost * lws_create_vhost(lws_context *context,lws_context_creation_info *info)

{
  lws_callback_function *plVar1;
  lws_protocols *plVar2;
  lws_http_mount *plVar3;
  lws_vhost *plVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  lws_vhost **pplVar12;
  int iVar13;
  lws_vhost *vhost;
  long lVar14;
  lws_role_ops *plVar15;
  size_t sVar16;
  char *pcVar17;
  lws_protocols *__dest;
  lws_dll2_owner *plVar18;
  lws_vhost **pplVar19;
  uint uVar20;
  lws_retry_bo_t *plVar21;
  lws_callback_function **pplVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  lws_protocols *plVar26;
  lws_role_ops **pplVar27;
  char buf [96];
  undefined6 local_98;
  undefined2 uStack_92;
  undefined6 uStack_90;
  undefined1 uStack_8a;
  undefined4 uStack_89;
  
  vhost = (lws_vhost *)lws_zalloc(0x2b8,"create vhost");
  if (vhost == (lws_vhost *)0x0) {
    return (lws_vhost *)0x0;
  }
  plVar26 = info->protocols;
  if ((plVar26 == (lws_protocols *)0x0) &&
     (plVar26 = (lws_protocols *)0x0, info->pprotocols == (lws_protocols **)0x0)) {
    plVar26 = protocols_dummy;
  }
  vhost->context = context;
  pcVar25 = "default";
  if (info->vhost_name != (char *)0x0) {
    pcVar25 = info->vhost_name;
  }
  vhost->name = pcVar25;
  (vhost->http).error_document_404 = info->error_document_404;
  if ((info->options & 0x400000) != 0) {
    _lws_log(8,"%s set to only support RAW\n");
  }
  vhost->iface = info->iface;
  vhost->bind_iface = info->bind_iface;
  plVar21 = &context->default_retry;
  if (info->retry_and_idle_policy != (lws_retry_bo_t *)0x0) {
    plVar21 = info->retry_and_idle_policy;
  }
  vhost->retry_policy = plVar21;
  if (plVar26 == (lws_protocols *)0x0) {
    lVar24 = -1;
    do {
      lVar14 = lVar24 + 1;
      lVar11 = lVar24 + 1;
      lVar24 = lVar14;
    } while (info->pprotocols[lVar11] != (lws_protocols *)0x0);
  }
  else {
    pplVar22 = &plVar26->callback;
    lVar14 = -1;
    do {
      lVar14 = lVar14 + 1;
      plVar1 = *pplVar22;
      pplVar22 = pplVar22 + 7;
    } while (plVar1 != (lws_callback_function *)0x0);
  }
  vhost->count_protocols = (int)lVar14;
  vhost->options = info->options;
  vhost->pvo = info->pvo;
  vhost->headers = info->headers;
  vhost->user = info->user;
  pvVar8 = info->finalize_arg;
  vhost->finalize = info->finalize;
  vhost->finalize_arg = pvVar8;
  uVar5 = *(undefined4 *)((long)&info->listen_accept_role + 4);
  uVar6 = *(undefined4 *)&info->listen_accept_protocol;
  uVar7 = *(undefined4 *)((long)&info->listen_accept_protocol + 4);
  *(undefined4 *)&vhost->listen_accept_role = *(undefined4 *)&info->listen_accept_role;
  *(undefined4 *)((long)&vhost->listen_accept_role + 4) = uVar5;
  *(undefined4 *)&vhost->listen_accept_protocol = uVar6;
  *(undefined4 *)((long)&vhost->listen_accept_protocol + 4) = uVar7;
  vhost->unix_socket_perms = info->unix_socket_perms;
  if (available_roles[0] != (lws_role_ops *)0x0) {
    pplVar27 = available_roles;
    plVar15 = available_roles[0];
    do {
      pplVar27 = pplVar27 + 1;
      if ((plVar15->init_vhost != (_func_int_lws_vhost_ptr_lws_context_creation_info_ptr *)0x0) &&
         (iVar13 = (*plVar15->init_vhost)(vhost,info), iVar13 != 0)) {
        return (lws_vhost *)0x0;
      }
      plVar15 = *pplVar27;
    } while (plVar15 != (lws_role_ops *)0x0);
  }
  iVar13 = 5;
  if (info->keepalive_timeout != 0) {
    iVar13 = info->keepalive_timeout;
  }
  vhost->keepalive_timeout = iVar13;
  uVar20 = 10;
  if (info->timeout_secs_ah_idle != 0) {
    uVar20 = info->timeout_secs_ah_idle;
  }
  vhost->timeout_secs_ah_idle = uVar20;
  (vhost->tls).alpn = info->alpn;
  (vhost->tls).ssl_info_event_mask = info->ssl_info_event_mask;
  if (info->ecdh_curve != (char *)0x0) {
    lws_strncpy((vhost->tls).ecdh_curve,info->ecdh_curve,0x10);
  }
  if (info->ssl_cert_filepath == (char *)0x0) {
    iVar13 = 0;
  }
  else {
    sVar16 = strlen(info->ssl_cert_filepath);
    iVar13 = (int)sVar16 + 1;
  }
  if (info->ssl_private_key_filepath != (char *)0x0) {
    sVar16 = strlen(info->ssl_private_key_filepath);
    iVar13 = iVar13 + (int)sVar16 + 1;
  }
  if (iVar13 != 0) {
    pcVar17 = (char *)lws_realloc((void *)0x0,(long)iVar13,"vh paths");
    (vhost->tls).alloc_cert_path = pcVar17;
    (vhost->tls).key_path = pcVar17;
    pcVar25 = info->ssl_cert_filepath;
    if (pcVar25 != (char *)0x0) {
      sVar16 = strlen(pcVar25);
      sVar16 = (size_t)((int)sVar16 + 1);
      memcpy(pcVar17,pcVar25,sVar16);
      pcVar17 = (vhost->tls).key_path + sVar16;
      (vhost->tls).key_path = pcVar17;
    }
    pcVar25 = info->ssl_private_key_filepath;
    if (pcVar25 != (char *)0x0) {
      sVar16 = strlen(pcVar25);
      memcpy(pcVar17,pcVar25,sVar16 + 1);
    }
  }
  __dest = (lws_protocols *)
           lws_zalloc((long)(vhost->count_protocols + (int)context->plugin_protocol_count + 1) *
                      0x38,"vhost-specific plugin table");
  if (__dest == (lws_protocols *)0x0) {
    _lws_log(1,"OOM\n");
    return (lws_vhost *)0x0;
  }
  uVar20 = vhost->count_protocols;
  if (plVar26 == (lws_protocols *)0x0) {
    if (0 < (int)uVar20) {
      uVar23 = 0;
      plVar26 = __dest;
      do {
        plVar2 = info->pprotocols[uVar23];
        plVar26->tx_packet_size = plVar2->tx_packet_size;
        pcVar25 = plVar2->name;
        plVar1 = plVar2->callback;
        sVar9 = plVar2->per_session_data_size;
        sVar10 = plVar2->rx_buffer_size;
        uVar5 = *(undefined4 *)&plVar2->field_0x24;
        pvVar8 = plVar2->user;
        plVar26->id = plVar2->id;
        *(undefined4 *)&plVar26->field_0x24 = uVar5;
        plVar26->user = pvVar8;
        plVar26->per_session_data_size = sVar9;
        plVar26->rx_buffer_size = sVar10;
        plVar26->name = pcVar25;
        plVar26->callback = plVar1;
        uVar23 = uVar23 + 1;
        plVar26 = plVar26 + 1;
      } while (uVar20 != uVar23);
    }
  }
  else {
    memcpy(__dest,plVar26,(long)(int)uVar20 * 0x38);
  }
  vhost->protocols = __dest;
  vhost->field_0x2b4 = vhost->field_0x2b4 | 1;
  plVar18 = (lws_dll2_owner *)lws_zalloc((long)vhost->count_protocols * 0x18,"same vh list");
  vhost->same_vh_protocol_owner = plVar18;
  (vhost->http).mount_list = info->mounts;
  if (info->port == -2) {
    uStack_90 = 0x2972656e65;
    local_98 = 0x696c206f6e28;
    uStack_92 = 0x7473;
  }
  else if (info->port == -1) {
    local_98 = 0x697672657328;
    uStack_92 = 0x676e;
    uStack_90 = 0x626173696420;
    uStack_8a = 0x6c;
    uStack_89 = 0x296465;
  }
  else {
    lws_snprintf((char *)&local_98,0x60,"port %u");
  }
  pcVar25 = (char *)&local_98;
  _lws_log(8,"Creating Vhost \'%s\' %s, %d protocols, IPv6 %s\n",vhost->name,pcVar25,
           (ulong)(uint)vhost->count_protocols,"off");
  for (plVar3 = info->mounts; plVar3 != (lws_http_mount *)0x0; plVar3 = plVar3->mount_next) {
    _lws_log(8,"   mounting %s%s to %s\n",
             mount_protocols_rel +
             *(int *)(mount_protocols_rel + (ulong)plVar3->origin_protocol * 4),plVar3->origin,
             plVar3->mountpoint);
  }
  vhost->listen_port = info->port;
  (vhost->http).http_proxy_port = 0;
  (vhost->http).http_proxy_address[0] = '\0';
  pcVar17 = info->http_proxy_address;
  if (pcVar17 == (char *)0x0) {
    pcVar17 = getenv("http_proxy");
    if (pcVar17 != (char *)0x0) {
      lws_strncpy(pcVar25,pcVar17,0x60);
      goto LAB_001138d0;
    }
  }
  else {
    pcVar25 = pcVar17;
    if (info->http_proxy_port != 0) {
      (vhost->http).http_proxy_port = info->http_proxy_port;
    }
LAB_001138d0:
    lws_set_proxy(vhost,pcVar25);
  }
  vhost->ka_interval = info->ka_interval;
  iVar13 = info->ka_probes;
  vhost->ka_time = info->ka_time;
  vhost->ka_probes = iVar13;
  if ((vhost->options & 0x8000) != 0) {
    _lws_log(4,"   STS enabled\n");
  }
  iVar13 = lws_context_init_server_ssl(info,vhost);
  if (iVar13 == 0) {
    iVar13 = lws_context_init_client_ssl(info,vhost);
    if (iVar13 == 0) {
      iVar13 = _lws_vhost_init_server(info,vhost);
      if (iVar13 < 0) {
        _lws_log(1,"init server failed\n");
        goto LAB_0011394d;
      }
      pplVar12 = &context->vhost_list;
      do {
        pplVar19 = pplVar12;
        plVar4 = *pplVar19;
        pplVar12 = &plVar4->vhost_next;
      } while (plVar4 != (lws_vhost *)0x0);
      *pplVar19 = vhost;
      if ((context->field_0x510 & 0x40) == 0) {
        return vhost;
      }
      iVar13 = lws_protocol_init(context);
      if (iVar13 == 0) {
        return vhost;
      }
      pcVar25 = "%s: lws_protocol_init failed\n";
    }
    else {
      pcVar25 = "%s: lws_context_init_client_ssl failed\n";
    }
  }
  else {
    pcVar25 = "%s: lws_context_init_server_ssl failed\n";
  }
  _lws_log(1,pcVar25,"lws_create_vhost");
LAB_0011394d:
  lws_vhost_destroy(vhost);
  return (lws_vhost *)0x0;
}

Assistant:

struct lws_vhost *
lws_create_vhost(struct lws_context *context,
		 const struct lws_context_creation_info *info)
{
	struct lws_vhost *vh = lws_zalloc(sizeof(*vh), "create vhost"),
			 **vh1 = &context->vhost_list;
	const struct lws_http_mount *mounts;
	const struct lws_protocols *pcols = info->protocols;
#ifdef LWS_WITH_PLUGINS
	struct lws_plugin *plugin = context->plugin_list;
#endif
	struct lws_protocols *lwsp;
	int m, f = !info->pvo, fx = 0, abs_pcol_count = 0, sec_pcol_count = 0;
	char buf[96];
#if ((defined(LWS_CLIENT_HTTP_PROXYING) && defined(LWS_WITH_CLIENT)) \
		|| defined(LWS_WITH_SOCKS5)) && defined(LWS_HAVE_GETENV)
	char *p;
#endif
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	extern struct lws_protocols lws_async_dns_protocol;
#endif
	int n;

	if (!vh)
		return NULL;

#if LWS_MAX_SMP > 1
	pthread_mutex_init(&vh->lock, NULL);
#endif

	if (!pcols && !info->pprotocols)
		pcols = &protocols_dummy[0];

	vh->context = context;
	if (!info->vhost_name)
		vh->name = "default";
	else
		vh->name = info->vhost_name;

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.error_document_404 = info->error_document_404;
#endif

	if (lws_check_opt(info->options, LWS_SERVER_OPTION_ONLY_RAW))
		lwsl_info("%s set to only support RAW\n", vh->name);

	vh->iface = info->iface;
#if !defined(LWS_PLAT_FREERTOS) && !defined(OPTEE_TA) && !defined(WIN32)
	vh->bind_iface = info->bind_iface;
#endif
	/* apply the context default lws_retry */

	if (info->retry_and_idle_policy)
		vh->retry_policy = info->retry_and_idle_policy;
	else
		vh->retry_policy = &context->default_retry;

	/*
	 * let's figure out how many protocols the user is handing us, using the
	 * old or new way depending on what he gave us
	 */

	if (!pcols)
		for (vh->count_protocols = 0;
			info->pprotocols[vh->count_protocols];
			vh->count_protocols++)
			;
	else
		for (vh->count_protocols = 0;
			pcols[vh->count_protocols].callback;
			vh->count_protocols++)
				;

	vh->options = info->options;
	vh->pvo = info->pvo;
	vh->headers = info->headers;
	vh->user = info->user;
	vh->finalize = info->finalize;
	vh->finalize_arg = info->finalize_arg;
	vh->listen_accept_role = info->listen_accept_role;
	vh->listen_accept_protocol = info->listen_accept_protocol;
	vh->unix_socket_perms = info->unix_socket_perms;

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->init_vhost)
			if (ar->init_vhost(vh, info))
				return NULL;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;


	if (info->keepalive_timeout)
		vh->keepalive_timeout = info->keepalive_timeout;
	else
		vh->keepalive_timeout = 5;

	if (info->timeout_secs_ah_idle)
		vh->timeout_secs_ah_idle = info->timeout_secs_ah_idle;
	else
		vh->timeout_secs_ah_idle = 10;

#if defined(LWS_WITH_TLS)

	vh->tls.alpn = info->alpn;
	vh->tls.ssl_info_event_mask = info->ssl_info_event_mask;

	if (info->ecdh_curve)
		lws_strncpy(vh->tls.ecdh_curve, info->ecdh_curve,
			    sizeof(vh->tls.ecdh_curve));

	/* carefully allocate and take a copy of cert + key paths if present */
	n = 0;
	if (info->ssl_cert_filepath)
		n += (int)strlen(info->ssl_cert_filepath) + 1;
	if (info->ssl_private_key_filepath)
		n += (int)strlen(info->ssl_private_key_filepath) + 1;

	if (n) {
		vh->tls.key_path = vh->tls.alloc_cert_path =
					lws_malloc(n, "vh paths");
		if (info->ssl_cert_filepath) {
			n = (int)strlen(info->ssl_cert_filepath) + 1;
			memcpy(vh->tls.alloc_cert_path,
			       info->ssl_cert_filepath, n);
			vh->tls.key_path += n;
		}
		if (info->ssl_private_key_filepath)
			memcpy(vh->tls.key_path, info->ssl_private_key_filepath,
			       strlen(info->ssl_private_key_filepath) + 1);
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	fx = 1;
#endif
#if defined(LWS_WITH_ABSTRACT)
	abs_pcol_count = (int)LWS_ARRAY_SIZE(available_abstract_protocols) - 1;
#endif
#if defined(LWS_WITH_SECURE_STREAMS)
	sec_pcol_count = (int)LWS_ARRAY_SIZE(available_secstream_protocols) - 1;
#endif

	/*
	 * give the vhost a unified list of protocols including:
	 *
	 * - internal, async_dns if enabled (first vhost only)
	 * - internal, abstracted ones
	 * - the ones that came from plugins
	 * - his user protocols
	 */
	lwsp = lws_zalloc(sizeof(struct lws_protocols) *
				(vh->count_protocols +
				   abs_pcol_count + sec_pcol_count +
				   context->plugin_protocol_count +
				   fx + 1),
			  "vhost-specific plugin table");
	if (!lwsp) {
		lwsl_err("OOM\n");
		return NULL;
	}

	/*
	 * 1: user protocols (from pprotocols or protocols)
	 */

	m = vh->count_protocols;
	if (!pcols) {
		for (n = 0; n < m; n++)
			memcpy(&lwsp[n], info->pprotocols[n], sizeof(lwsp[0]));
	} else
		memcpy(lwsp, pcols, sizeof(struct lws_protocols) * m);

	/*
	 * 2: abstract protocols
	 */
#if defined(LWS_WITH_ABSTRACT)
	for (n = 0; n < abs_pcol_count; n++) {
		memcpy(&lwsp[m++], available_abstract_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif
	/*
	 * 3: async dns protocol (first vhost only)
	 */
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!context->vhost_list) {
		memcpy(&lwsp[m++], &lws_async_dns_protocol,
		       sizeof(struct lws_protocols));
		vh->count_protocols++;
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	for (n = 0; n < sec_pcol_count; n++) {
		memcpy(&lwsp[m++], available_secstream_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif

	/*
	 * 3: For compatibility, all protocols enabled on vhost if only
	 * the default vhost exists.  Otherwise only vhosts who ask
	 * for a protocol get it enabled.
	 */

	if (context->options & LWS_SERVER_OPTION_EXPLICIT_VHOSTS)
		f = 0;
	(void)f;
#ifdef LWS_WITH_PLUGINS
	if (plugin) {
		while (plugin) {
			for (n = 0; n < plugin->caps.count_protocols; n++) {
				/*
				 * for compatibility's sake, no pvo implies
				 * allow all protocols
				 */
				if (f || lws_vhost_protocol_options(vh,
				    plugin->caps.protocols[n].name)) {
					memcpy(&lwsp[m],
					       &plugin->caps.protocols[n],
					       sizeof(struct lws_protocols));
					m++;
					vh->count_protocols++;
				}
			}
			plugin = plugin->list;
		}
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	memcpy(&lwsp[m++], &lws_ws_proxy, sizeof(*lwsp));
	vh->count_protocols++;
#endif

	vh->protocols = lwsp;
	vh->allocated_vhost_protocols = 1;

	vh->same_vh_protocol_owner = (struct lws_dll2_owner *)
			lws_zalloc(sizeof(struct lws_dll2_owner) *
				   vh->count_protocols, "same vh list");
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.mount_list = info->mounts;
#endif

#ifdef LWS_WITH_UNIX_SOCK
	if (LWS_UNIX_SOCK_ENABLED(vh)) {
		lwsl_info("Creating Vhost '%s' path \"%s\", %d protocols\n",
				vh->name, vh->iface, vh->count_protocols);
	} else
#endif
	{
		switch(info->port) {
		case CONTEXT_PORT_NO_LISTEN:
			strcpy(buf, "(serving disabled)");
			break;
		case CONTEXT_PORT_NO_LISTEN_SERVER:
			strcpy(buf, "(no listener)");
			break;
		default:
			lws_snprintf(buf, sizeof(buf), "port %u", info->port);
			break;
		}
		lwsl_info("Creating Vhost '%s' %s, %d protocols, IPv6 %s\n",
			    vh->name, buf, vh->count_protocols,
			    LWS_IPV6_ENABLED(vh) ? "on" : "off");
	}
	mounts = info->mounts;
	while (mounts) {
		(void)mount_protocols[0];
		lwsl_info("   mounting %s%s to %s\n",
			  mount_protocols[mounts->origin_protocol],
			  mounts->origin, mounts->mountpoint);

		mounts = mounts->mount_next;
	}

	vh->listen_port = info->port;

#if defined(LWS_WITH_SOCKS5)
	vh->socks_proxy_port = 0;
	vh->socks_proxy_address[0] = '\0';
#endif

#if defined(LWS_WITH_CLIENT) && defined(LWS_CLIENT_HTTP_PROXYING)
	/* either use proxy from info, or try get it from env var */
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.http_proxy_port = 0;
	vh->http.http_proxy_address[0] = '\0';
	/* http proxy */
	if (info->http_proxy_address) {
		/* override for backwards compatibility */
		if (info->http_proxy_port)
			vh->http.http_proxy_port = info->http_proxy_port;
		lws_set_proxy(vh, info->http_proxy_address);
	} else
#endif
	{
#ifdef LWS_HAVE_GETENV
#if defined(__COVERITY__)
		p = NULL;
#else
		p = getenv("http_proxy"); /* coverity[tainted_scalar] */
		if (p) {
			lws_strncpy(buf, p, sizeof(buf));
			lws_set_proxy(vh, buf);
		}
#endif
#endif
	}
#endif
#if defined(LWS_WITH_SOCKS5)
	lws_socks5c_ads_server(vh, info);
#endif

	vh->ka_time = info->ka_time;
	vh->ka_interval = info->ka_interval;
	vh->ka_probes = info->ka_probes;

	if (vh->options & LWS_SERVER_OPTION_STS)
		lwsl_notice("   STS enabled\n");

#ifdef LWS_WITH_ACCESS_LOG
	if (info->log_filepath) {
		vh->log_fd = lws_open(info->log_filepath,
				  O_CREAT | O_APPEND | O_RDWR, 0600);
		if (vh->log_fd == (int)LWS_INVALID_FILE) {
			lwsl_err("unable to open log filepath %s\n",
				 info->log_filepath);
			goto bail;
		}
#ifndef WIN32
		if (context->uid != -1)
			if (chown(info->log_filepath, context->uid,
				  context->gid) == -1)
				lwsl_err("unable to chown log file %s\n",
						info->log_filepath);
#endif
	} else
		vh->log_fd = (int)LWS_INVALID_FILE;
#endif
	if (lws_context_init_server_ssl(info, vh)) {
		lwsl_err("%s: lws_context_init_server_ssl failed\n", __func__);
		goto bail1;
	}
	if (lws_context_init_client_ssl(info, vh)) {
		lwsl_err("%s: lws_context_init_client_ssl failed\n", __func__);
		goto bail1;
	}
#if defined(LWS_WITH_SERVER)
	lws_context_lock(context, "create_vhost");
	n = _lws_vhost_init_server(info, vh);
	lws_context_unlock(context);
	if (n < 0) {
		lwsl_err("init server failed\n");
		goto bail1;
	}
#endif
	n = !!context->vhost_list;

	while (1) {
		if (!(*vh1)) {
			*vh1 = vh;
			break;
		}
		vh1 = &(*vh1)->vhost_next;
	};

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!n && lws_async_dns_init(context))
		goto bail1;
#endif

	/* for the case we are adding a vhost much later, after server init */

	if (context->protocol_init_done)
		if (lws_protocol_init(context)) {
			lwsl_err("%s: lws_protocol_init failed\n", __func__);
			goto bail1;
		}

	return vh;

bail1:
	lws_vhost_destroy(vh);

	return NULL;

#ifdef LWS_WITH_ACCESS_LOG
bail:
	lws_free(vh);
#endif

	return NULL;
}